

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int fmt::v8::detail::parse_nonnegative_int<wchar_t>(wchar_t **begin,wchar_t *end,int error_value)

{
  bool bVar1;
  wchar_t *pwVar2;
  long lVar3;
  uint local_4c;
  uint max;
  long num_digits;
  wchar_t *p;
  uint local_28;
  uint prev;
  uint value;
  int error_value_local;
  wchar_t *end_local;
  wchar_t **begin_local;
  
  if (((*begin != end) && (L'/' < **begin)) && (**begin < L':')) {
    local_28 = 0;
    pwVar2 = *begin;
    begin_local._4_4_ = local_28;
    do {
      local_28 = begin_local._4_4_;
      num_digits = (long)pwVar2;
      begin_local._4_4_ = local_28 * 10 + *(int *)num_digits + -0x30;
      pwVar2 = (wchar_t *)(num_digits + 4);
      bVar1 = false;
      if ((pwVar2 != end) && (bVar1 = false, L'/' < *pwVar2)) {
        bVar1 = *pwVar2 < L':';
      }
    } while (bVar1);
    lVar3 = (long)pwVar2 - (long)*begin >> 2;
    *begin = pwVar2;
    if (9 < lVar3) {
      local_4c = error_value;
      if ((lVar3 == 10) && ((ulong)local_28 * 10 + (ulong)(*(int *)num_digits - 0x30) < 0x80000000))
      {
        local_4c = begin_local._4_4_;
      }
      begin_local._4_4_ = local_4c;
    }
    return begin_local._4_4_;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
             ,0x8ca,"");
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}